

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

int macro_getargs(int ip)

{
  bool bVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  long lVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  size_t sVar7;
  __int32_t **pp_Var8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  byte bVar18;
  long lVar19;
  char cVar20;
  ulong uVar21;
  char (*__src) [80];
  char (*pacVar22) [80];
  bool bVar23;
  undefined1 auVar24 [16];
  
  lVar4 = (long)midx;
  if (lVar4 == 7) {
    pcVar16 = "Too many nested macro calls!";
LAB_0010dc09:
    error(pcVar16);
    return 0;
  }
  uVar14 = (ulong)(uint)ip;
  mcntstack[lVar4] = mcounter;
  iVar9 = midx + 1;
  midx = iVar9;
  mstack[lVar4] = mlptr;
  auVar2 = _DAT_001138b0;
  pacVar22 = marg[iVar9];
  lVar4 = 0x50;
  auVar24 = _DAT_001138a0;
  do {
    if (SUB164(auVar24 ^ auVar2,4) == -0x80000000 && SUB164(auVar24 ^ auVar2,0) < -0x7ffffff7) {
      *(undefined1 *)((long)&mlptr + lVar4 + (long)iVar9 * 800) = 0;
      (*pacVar22)[lVar4] = '\0';
    }
    lVar19 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 2;
    auVar24._8_8_ = lVar19 + 2;
    lVar4 = lVar4 + 0xa0;
  } while (lVar4 != 0x370);
  ppuVar5 = __ctype_b_loc();
  iVar9 = 0;
LAB_0010d816:
  do {
    while( true ) {
      iVar15 = (int)uVar14;
      pbVar6 = (byte *)(prlnbuf + iVar15);
      do {
        uVar13 = uVar14;
        iVar15 = iVar15 + 1;
        uVar12 = (int)uVar13 + 1;
        uVar14 = (ulong)uVar12;
        bVar3 = *pbVar6;
        uVar21 = (ulong)(char)bVar3;
        pbVar6 = pbVar6 + 1;
      } while ((*(byte *)((long)*ppuVar5 + uVar21 * 2 + 1) & 0x20) != 0);
      if (bVar3 < 0x3b) break;
      if (bVar3 != 0x5c) {
        if (bVar3 == 0x3b) {
          return 1;
        }
        if (bVar3 != 0x7b) goto LAB_0010d919;
        bVar3 = 0x7d;
        bVar1 = false;
        lVar4 = 0;
LAB_0010dab4:
        bVar18 = prlnbuf[(int)uVar12];
        if (bVar18 == 0) {
LAB_0010dc1f:
          pcVar16 = "Unterminated string!";
        }
        else {
          lVar19 = 0;
          pbVar6 = (byte *)(prlnbuf + ((int)uVar13 + 2));
          while( true ) {
            lVar17 = lVar4 + lVar19;
            if (lVar17 == 0x50) {
              pcVar16 = "String too long, max. 80 characters!";
              goto LAB_0010dc09;
            }
            if (bVar18 == bVar3) break;
            (*(char (*) [80])*pacVar22)[lVar19 + lVar4] = bVar18;
            bVar18 = (prlnbuf + ((int)uVar13 + 2))[lVar19];
            lVar19 = lVar19 + 1;
            uVar14 = (ulong)((int)uVar14 + 1);
            pbVar6 = pbVar6 + 1;
            if (bVar18 == 0) goto LAB_0010dc1f;
          }
          if (bVar1) {
            lVar17 = lVar4 + lVar19 + 1;
            (*(char (*) [80])*pacVar22)[lVar4 + lVar19] = bVar3;
          }
          do {
            bVar3 = *pbVar6;
            uVar14 = (ulong)((int)uVar14 + 1);
            pbVar6 = pbVar6 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)(char)bVar3 * 2 + 1) & 0x20) != 0);
          if ((bVar3 < 0x3c) && ((0x800100000000001U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)) {
            __src = (char (*) [80])(*(char (*) [80])*pacVar22 + (int)lVar17);
            goto LAB_0010dbf8;
          }
          pcVar16 = "Syntax error!";
        }
        goto LAB_0010dc09;
      }
      pcVar16 = prlnbuf + iVar15;
      do {
        cVar20 = *pcVar16;
        pcVar16 = pcVar16 + 1;
      } while ((*(byte *)((long)*ppuVar5 + (long)cVar20 * 2 + 1) & 0x20) != 0);
      if ((cVar20 != '\0') && (cVar20 != ';')) {
LAB_0010d919:
        lVar4 = 0;
        lVar19 = 0;
        uVar11 = 0;
        bVar1 = false;
        iVar15 = 0;
        do {
          cVar20 = (char)uVar21;
          uVar10 = (uint)uVar21 & 0xff;
          if (uVar10 < 0x2c) {
            if (uVar10 == 0x28) {
LAB_0010d965:
              iVar15 = iVar15 + 1;
            }
            else if (uVar10 == 0x29) {
LAB_0010d956:
              bVar23 = iVar15 == 0;
              iVar15 = iVar15 + -1;
              if (bVar23) {
                iVar15 = 0;
              }
            }
            else if ((uVar21 & 0xff) == 0) goto LAB_0010d9fe;
LAB_0010d968:
            if (bVar1) {
              bVar1 = true;
              if (cVar20 != ' ') goto LAB_0010d994;
            }
            else {
              bVar1 = true;
              if (cVar20 != ' ') {
LAB_0010d9c7:
                lVar17 = (long)(int)uVar11;
                goto LAB_0010d9ca;
              }
            }
          }
          else {
            if (0x5a < uVar10) {
              if (uVar10 == 0x5b) goto LAB_0010d965;
              if (uVar10 == 0x5d) goto LAB_0010d956;
              goto LAB_0010d968;
            }
            if (uVar10 != 0x2c) {
              if (uVar10 != 0x3b) goto LAB_0010d968;
              goto LAB_0010d9fe;
            }
            if (iVar15 == 0) goto LAB_0010d9fe;
            if (!bVar1) goto LAB_0010d9c7;
LAB_0010d994:
            lVar17 = (long)(int)uVar11;
            if (lVar17 < lVar19) {
              uVar10 = ~uVar11;
              uVar11 = (uint)lVar19;
              memset(*(char (*) [80])*pacVar22 + lVar17,0x20,(ulong)(uVar10 + uVar11) + 1);
              lVar17 = lVar4 >> 0x20;
            }
LAB_0010d9ca:
            (*(char (*) [80])*pacVar22)[lVar17] = cVar20;
            uVar11 = uVar11 + 1;
            bVar1 = false;
            if (uVar11 == 0x50) goto LAB_0010dc02;
          }
          uVar21 = (ulong)(byte)prlnbuf[lVar19 + (int)uVar12];
          lVar19 = lVar19 + 1;
          lVar4 = lVar4 + 0x100000000;
        } while( true );
      }
      if (pass == 1) {
        println();
        clearln();
      }
      iVar15 = readline();
      uVar14 = 0x1a;
      if (iVar15 == -1) {
        return 0;
      }
    }
    if (bVar3 == 0) {
      return 1;
    }
    if (bVar3 == 0x22) {
      (*(char (*) [80])*pacVar22)[0] = '\"';
      lVar4 = 1;
      bVar3 = 0x22;
      bVar1 = true;
      goto LAB_0010dab4;
    }
    if (bVar3 != 0x2c) goto LAB_0010d919;
    iVar9 = iVar9 + 1;
    pacVar22 = marg[midx] + iVar9;
  } while (iVar9 != 9);
  pcVar16 = "Too many arguments for a macro!";
  goto LAB_0010dc09;
LAB_0010d9fe:
  (*(char (*) [80])*pacVar22)[(int)uVar11] = '\0';
  uVar14 = (uVar13 & 0xffffffff) + lVar19;
  sVar7 = strlen(*pacVar22);
  if (((sVar7 != 0 && iVar9 != 0) &&
      (pp_Var8 = __ctype_tolower_loc(), ((*pp_Var8)[(*(char (*) [80])*pacVar22)[0]] & 0xfeU) == 0x78
      )) && ((iVar15 = strcasecmp(*pacVar22,"x++"), iVar15 == 0 ||
             ((iVar15 = strcasecmp(*pacVar22,"y++"), sVar7 == 1 || (iVar15 == 0)))))) {
    lVar4 = (long)midx;
    pacVar22 = marg[lVar4] + (iVar9 + -1);
    sVar7 = strlen(*pacVar22);
    if (0x4b < sVar7) {
LAB_0010dc02:
      pcVar16 = "Macro argument string too long, max. 80 characters!";
      goto LAB_0010dc09;
    }
    uVar14 = (uVar13 & 0xffffffff) + lVar19;
    sVar7 = strlen(*pacVar22);
    (*pacVar22 + sVar7)[0] = ',';
    (*pacVar22 + sVar7)[1] = '\0';
    __src = marg[lVar4] + iVar9;
    strcat(*pacVar22,*__src);
    pacVar22 = __src;
    iVar9 = iVar9 + -1;
LAB_0010dbf8:
    (*(char (*) [80])*__src)[0] = '\0';
  }
  goto LAB_0010d816;
}

Assistant:

int
macro_getargs(int ip)
{
	char *ptr;
	char  c, t;
	int   i, j, f, arg;
	int   level;

	/* can not nest too much macros */
	if (midx == 7) {
		error("Too many nested macro calls!");
		return (0);
	}

	/* initialize args */
	mcntstack[midx] = mcounter;
	mstack[midx++] = mlptr;
	ptr = marg[midx][0];
	arg = 0;

	for (i = 0; i < 9; i++)
		marg[midx][i][0] = '\0';

	/* extract args */
	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[ip]))
			ip++;

		c = prlnbuf[ip++];
		switch (c) {
		/* no arg */
		case ',':
			arg++;
			ptr = marg[midx][arg];
			if (arg == 9) {
				error("Too many arguments for a macro!");
				return (0);
			}
			break;

		/* string */
		case '{':
			c = '}';
		case '\"':
			i = 0;
			if (c == '\"')
				ptr[i++] = c;
			for (;;) {
				t = prlnbuf[ip++];
				if (t == '\0') {
					error("Unterminated string!");
					return (0);
				}
				if (i == 80) {
					error("String too long, max. 80 characters!");
					return (0);
				}
				if (t == c)
					break;
				ptr[i++] = t;
			}
			if (c == '\"')
				ptr[i++] = t;

			/* skip spaces */
			while (isspace(prlnbuf[ip]))
				ip++;

			/* check end of arg */
			switch (prlnbuf[ip]) {
			case '\0':
			case ',':
			case ';':
				break;

			default:
				error("Syntax error!");
				return (0);
			}

			/* end arg string */
			ptr[i] = '\0';
			break;

		/* end of line */
		case ';':
		case '\0':
			return (1);

		/* continuation char */
		case '\\':
			/* skip spaces */
			i = ip;
			while (isspace(prlnbuf[i]))
				i++;

			/* check */
			if (prlnbuf[i] == ';' || prlnbuf[i] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return (0);

				/* rewind line pointer and continue */
				ip = SFIELD;
				break;
			}

		/* other */
		default:
			i = 0;
			j = 0;
			f = 0;
			level = 0;
			while (c) {
				if (c == ',') {
					if (level == 0)
						break;
				}
				else if ((c == '(') || (c == '[')) {
					level++;
				}
				else if ((c == ')') || (c == ']')) {
					if (level)
						level--;
				}
				else if (c == ';') {
					break;
				}
				if (f) {
					if (c != ' ') {
						while (i < j)
							ptr[i++] = ' ';
						ptr[i++] = c;
						f = 0;
					}
				}
				else if (c == ' ') {
					f = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Macro argument string too long, max. 80 characters!");
					return (0);
				}
				j++;
				c = prlnbuf[ip++];
			}
			ptr[i] = '\0';
			ip--;

			/* check if arg is X or Y */
			if (strlen(ptr) && arg) {
				c = tolower(ptr[0]);

				if ((c == 'x') || (c == 'y')) {
					if ((strcasecmp(ptr, "x++") == 0) ||
						(strcasecmp(ptr, "y++") == 0) ||
						(strlen(ptr) == 1))
					{
						arg--;
						ptr = marg[midx][arg];

						/* check string length */
						if (strlen(ptr) > 75) {
							error("Macro argument string too long, max. 80 characters!");
							return (0);
						}

						/* attach current arg to the previous one */
						strcat(ptr, ",");
						strcat(ptr, marg[midx][arg + 1]);
						ptr = marg[midx][arg + 1];
						ptr[0] = '\0';
					}
			 	}
			}
			break;
		}
	}
}